

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

void __thiscall kj::writeLineToFd(kj *this,int fd,StringPtr message)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  int *piVar4;
  unsigned_long uVar5;
  undefined4 in_register_00000034;
  ssize_t local_70;
  ssize_t n;
  int local_54;
  iovec *piStack_50;
  uint count;
  iovec *pos;
  iovec vec [2];
  undefined1 auStack_18 [4];
  int fd_local;
  StringPtr message_local;
  
  _auStack_18 = (char *)CONCAT44(in_register_00000034,fd);
  message_local.content.ptr = message.content.ptr;
  sVar3 = StringPtr::size((StringPtr *)auStack_18);
  if (sVar3 != 0) {
    pos = (iovec *)StringPtr::begin((StringPtr *)auStack_18);
    vec[0].iov_base = (void *)StringPtr::size((StringPtr *)auStack_18);
    vec[0].iov_len = (long)"();\n\n" + 4;
    vec[1].iov_base = (void *)0x1;
    piStack_50 = (iovec *)&pos;
    StringPtr::StringPtr((StringPtr *)&n,"\n");
    bVar2 = StringPtr::endsWith((StringPtr *)auStack_18,(StringPtr *)&n);
    local_54 = 2;
    if (bVar2) {
      local_54 = 1;
    }
    do {
      while (local_70 = writev((int)this,piStack_50,local_54), -1 < local_70) {
        while( true ) {
          if (local_54 == 0) {
            return;
          }
          uVar1 = piStack_50->iov_len;
          uVar5 = implicitCast<unsigned_long,long&>(&local_70);
          if (uVar5 < uVar1) break;
          local_70 = local_70 - piStack_50->iov_len;
          piStack_50 = piStack_50 + 1;
          local_54 = local_54 + -1;
        }
        piStack_50->iov_base = (void *)((long)piStack_50->iov_base + local_70);
        piStack_50->iov_len = piStack_50->iov_len - local_70;
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  }
  return;
}

Assistant:

static void writeLineToFd(int fd, StringPtr message) {
  // Write the given message to the given file descriptor with a trailing newline iff the message
  // is non-empty and doesn't already have a trailing newline.  We use writev() to do this in a
  // single system call without any copying (OS permitting).

  if (message.size() == 0) {
    return;
  }

#if _WIN32
  KJ_STACK_ARRAY(char, newlineExpansionBuffer, 2 * (message.size() + 1), 128, 512);
  char* p = newlineExpansionBuffer.begin();
  for(char ch : message) {
    if(ch == '\n') {
      *(p++) = '\r';
    }
    *(p++) = ch;
  }
  if(!message.endsWith("\n")) {
    *(p++) = '\r';
    *(p++) = '\n';
  }

  size_t newlineExpandedSize = p - newlineExpansionBuffer.begin();

  KJ_ASSERT(newlineExpandedSize <= newlineExpansionBuffer.size());

  HANDLE handle = reinterpret_cast<HANDLE>(_get_osfhandle(fd));
  DWORD consoleMode;
  bool redirectedToFile = !GetConsoleMode(handle, &consoleMode);

  DWORD writtenSize;
  if(redirectedToFile) {
    WriteFile(handle, newlineExpansionBuffer.begin(), newlineExpandedSize, &writtenSize, nullptr);
  } else {
    KJ_STACK_ARRAY(wchar_t, buffer, newlineExpandedSize, 128, 512);

    size_t finalSize = MultiByteToWideChar(
      CP_UTF8,
      0,
      newlineExpansionBuffer.begin(),
      newlineExpandedSize,
      buffer.begin(),
      buffer.size());

    KJ_ASSERT(finalSize <= buffer.size());

    WriteConsoleW(handle, buffer.begin(), finalSize, &writtenSize, nullptr);
  }
#else
  // Unfortunately the writev interface requires non-const pointers even though it won't modify
  // the data.
  struct iovec vec[2];
  vec[0].iov_base = const_cast<char*>(message.begin());
  vec[0].iov_len = message.size();
  vec[1].iov_base = const_cast<char*>("\n");
  vec[1].iov_len = 1;

  struct iovec* pos = vec;

  // Only use the second item in the vec if the message doesn't already end with \n.
  uint count = message.endsWith("\n") ? 1 : 2;

  for (;;) {
    ssize_t n = writev(fd, pos, count);
    if (n < 0) {
      if (errno == EINTR) {
        continue;
      } else {
        // This function is meant for writing to stdout and stderr.  If writes fail on those FDs
        // there's not a whole lot we can reasonably do, so just ignore it.
        return;
      }
    }

    // Update chunks to discard what was successfully written.
    for (;;) {
      if (count == 0) {
        // Done writing.
        return;
      } else if (pos->iov_len <= implicitCast<size_t>(n)) {
        // Wrote this entire chunk.
        n -= pos->iov_len;
        ++pos;
        --count;
      } else {
        // Wrote only part of this chunk.  Adjust the pointer and then retry.
        pos->iov_base = reinterpret_cast<byte*>(pos->iov_base) + n;
        pos->iov_len -= n;
        break;
      }
    }
  }
#endif
}